

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * nivalis::util::str_replace
                   (string *__return_storage_ptr__,string_view src,string *from,string_view to)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  size_type sVar6;
  ulong uVar7;
  allocator_type local_69;
  string_view to_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> za;
  string_view src_local;
  
  to_local._M_str = to._M_str;
  to_local._M_len = to._M_len;
  src_local._M_str = src._M_str;
  src_local._M_len = src._M_len;
  uVar1 = from->_M_string_length;
  std::__cxx11::string::push_back((char)from);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)from,&src_local);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&za,from->_M_string_length,&local_69);
  sVar6 = from->_M_string_length;
  *za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = sVar6;
  lVar4 = -1;
  uVar5 = 0;
  uVar7 = 0;
  for (uVar3 = 1; uVar3 < sVar6; uVar3 = uVar3 + 1) {
    if ((uVar5 < uVar3) ||
       ((uVar5 - uVar3) + 1 <=
        za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3 - uVar7])) {
      if (uVar5 < uVar3) {
        uVar5 = uVar3;
      }
      for (; (uVar5 < sVar6 &&
             (pcVar2 = (from->_M_dataplus)._M_p, pcVar2[uVar5] == pcVar2[lVar4 + uVar5]));
          uVar5 = uVar5 + 1) {
      }
      za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = lVar4 + uVar5;
      uVar5 = uVar5 - 1;
      uVar7 = uVar3;
    }
    else {
      za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] =
           za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3 - uVar7];
    }
    sVar6 = from->_M_string_length;
    lVar4 = lVar4 + -1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar3 = uVar1;
  while (uVar3 + 1 < from->_M_string_length) {
    if (za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3 + 1] < uVar1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar3 = uVar3 + 1;
    }
    else {
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__return_storage_ptr__,&to_local);
      uVar3 = uVar3 + uVar1;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string str_replace(std::string_view src, std::string from, std::string_view to) {
    size_t sz = from.size();
    from.push_back('\v'); from.append(src);

    std::vector<size_t> za(from.size());
    za[0] = from.size();
    size_t left = 0, right = 0;
    for (size_t i = 1; i < from.size(); ++i) {
        if (right >= i && size_t(za[i - left]) < right - i + 1) za[i] = za[i - left];
        else {
            left = i; right = std::max(i, right);
            while (right < from.size() && from[right] == from[right - left]) ++right;
            za[i] = right - left; --right;
        }
    }
    std::string out; out.reserve(src.size());
    for (size_t i = sz + 1; i < from.size(); ++i) {
        if (za[i] >= sz) {
            out.append(to);
            i += sz - 1;
        } else {
            out.push_back(from[i]);
        }
    }
    return out;
}